

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O2

void __thiscall SSD1306::FileDescriptor::~FileDescriptor(FileDescriptor *this)

{
  bool bVar1;
  
  bVar1 = std::function<bool_(int)>::operator()(&this->close_if_,this->fd_);
  if (bVar1) {
    close(this->fd_);
  }
  std::_Function_base::~_Function_base(&(this->close_if_).super__Function_base);
  return;
}

Assistant:

SSD1306::FileDescriptor::~FileDescriptor()
{
    if (close_if_(fd_))
    {
        ::close(fd_);
    }
}